

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O2

void * override_EGL_eglGetProcAddress(char *name)

{
  char cVar1;
  void *pvVar2;
  code *UNRECOVERED_JUMPTABLE;
  
  cVar1 = *name;
  if (cVar1 == 'g') {
    if (name[1] != 'l') goto LAB_0010295d;
    pvVar2 = wrapped_dlsym("GLES2",name);
    if (pvVar2 != (void *)0x0) {
      return pvVar2;
    }
    cVar1 = *name;
  }
  if ((((cVar1 == 'e') && (name[1] == 'g')) && (name[2] == 'l')) &&
     (pvVar2 = wrapped_dlsym("EGL",name), pvVar2 != (void *)0x0)) {
    return pvVar2;
  }
LAB_0010295d:
  pvVar2 = dlwrap_real_dlopen("libEGL.so.1",1);
  UNRECOVERED_JUMPTABLE = (code *)dlwrap_real_dlsym(pvVar2,"eglGetProcAddress");
  pvVar2 = (void *)(*UNRECOVERED_JUMPTABLE)(name);
  return pvVar2;
}

Assistant:

void *
override_EGL_eglGetProcAddress(const char *name)
{
    void *symbol;

    if (!STRNCMP_LITERAL(name, "gl")) {
        symbol = wrapped_dlsym("GLES2", name);
        if (symbol)
            return symbol;
    }

    if (!STRNCMP_LITERAL(name, "egl")) {
        symbol = wrapped_dlsym("EGL", name);
        if (symbol)
            return symbol;
    }

    return DEFER_TO_GL("libEGL.so.1", override_EGL_eglGetProcAddress,
                       "eglGetProcAddress", (name));
}